

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O3

bool __thiscall dmlc::JSONReader::NextObjectItem(JSONReader *this,string *out_key)

{
  pointer *ppuVar1;
  pointer puVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  size_t *psVar6;
  int ch;
  LogCheckError _check_err;
  char local_1dd;
  int local_1dc;
  LogCheckError local_1d8;
  string local_1d0;
  LogMessageFatal local_1b0;
  
  if ((this->scope_counter_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish[-1] == 0) {
    while( true ) {
      iVar3 = std::istream::peek();
      psVar6 = &this->line_count_n_;
      if ((iVar3 == 10) || (psVar6 = &this->line_count_r_, iVar3 == 0xd)) {
        *psVar6 = *psVar6 + 1;
      }
      iVar4 = isspace(iVar3);
      if (iVar4 == 0) break;
      std::istream::get();
    }
    if (iVar3 == 0x7d) {
      std::istream::get();
      goto LAB_00115118;
    }
  }
  else {
    do {
      local_1dc = std::istream::get();
      psVar6 = &this->line_count_n_;
      if ((local_1dc == 10) || (psVar6 = &this->line_count_r_, local_1dc == 0xd)) {
        *psVar6 = *psVar6 + 1;
      }
      iVar3 = isspace(local_1dc);
    } while (iVar3 != 0);
    if ((local_1dc == -1) || (local_1dc == 0x7d)) {
LAB_00115118:
      ppuVar1 = &(this->scope_counter_).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + -1;
      return false;
    }
    local_1b0.log_stream_ = (ostringstream)0x2c;
    LogCheck_EQ<int,char>((dmlc *)&local_1d8,&local_1dc,(char *)&local_1b0);
    if (local_1d8.str != (string *)0x0) {
      LogMessageFatal::LogMessageFatal
                (&local_1b0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
                 ,0x305);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"Check failed: ",0xe)
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"ch == \',\'",9);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1b0,((local_1d8.str)->_M_dataplus)._M_p,
                          (local_1d8.str)->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Error at",8);
      line_info_abi_cxx11_(&local_1d0,this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,", JSON object expect \'}\' or \',\' \'",0x21);
      local_1dd = (char)local_1dc;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_1dd,1);
      local_1dd = '\'';
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_1dd,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      LogMessageFatal::~LogMessageFatal(&local_1b0);
    }
    LogCheckError::~LogCheckError(&local_1d8);
  }
  puVar2 = (this->scope_counter_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish + -1;
  *puVar2 = *puVar2 + 1;
  ReadString(this,out_key);
  do {
    iVar3 = std::istream::get();
    psVar6 = &this->line_count_n_;
    if ((iVar3 == 10) || (psVar6 = &this->line_count_r_, iVar3 == 0xd)) {
      *psVar6 = *psVar6 + 1;
    }
    iVar4 = isspace(iVar3);
  } while (iVar4 != 0);
  local_1b0.log_stream_ = (ostringstream)0x3a;
  local_1dc = iVar3;
  LogCheck_EQ<int,char>((dmlc *)&local_1d8,&local_1dc,(char *)&local_1b0);
  if (local_1d8.str != (string *)0x0) {
    LogMessageFatal::LogMessageFatal
              (&local_1b0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
               ,0x317);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"Check failed: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"ch == \':\'",9);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1b0,((local_1d8.str)->_M_dataplus)._M_p,
                        (local_1d8.str)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Error at",8);
    line_info_abi_cxx11_(&local_1d0,this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", Expect \':\' but get \'",0x16);
    local_1dd = (char)local_1dc;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_1dd,1);
    local_1dd = '\'';
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_1dd,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    LogMessageFatal::~LogMessageFatal(&local_1b0);
  }
  LogCheckError::~LogCheckError(&local_1d8);
  return true;
}

Assistant:

inline bool JSONReader::NextObjectItem(std::string *out_key) {
  bool next = true;
  if (scope_counter_.back() != 0) {
    int ch = NextNonSpace();
    if (ch == EOF) {
      next = false;
    } else if (ch == '}') {
      next = false;
    } else {
      CHECK_EQ(ch, ',')
          << "Error at" << line_info()
          << ", JSON object expect \'}\' or \',\' \'" << static_cast<char>(ch) << '\'';
    }
  } else {
    int ch = PeekNextNonSpace();
    if (ch == '}') {
      NextChar();
      next = false;
    }
  }
  if (!next) {
    scope_counter_.pop_back();
    return false;
  } else {
    scope_counter_.back() += 1;
    ReadString(out_key);
    int ch = NextNonSpace();
    CHECK_EQ(ch, ':')
        << "Error at" << line_info()
        << ", Expect \':\' but get \'" << static_cast<char>(ch) << '\'';
    return true;
  }
}